

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

hugeint_t duckdb::BinaryNumericDivideHugeintWrapper::
          Operation<bool,duckdb::ModuloOperator,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                    (bool fun,hugeint_t left,hugeint_t right,ValidityMask *mask,idx_t idx)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar1;
  hugeint_t right_00;
  hugeint_t left_00;
  _Alloc_hider _Var2;
  size_type sVar3;
  bool bVar4;
  TemplatedValidityData<unsigned_long> *pTVar5;
  _Head_base<0UL,_unsigned_long_*,_false> _Var6;
  OutOfRangeException *this_00;
  uint64_t uVar7;
  int64_t iVar8;
  uint64_t uVar9;
  int64_t iVar10;
  hugeint_t hVar11;
  string local_98;
  hugeint_t local_78;
  string local_68;
  string local_48;
  
  iVar10 = right.upper;
  uVar7 = right.lower;
  iVar8 = left.upper;
  uVar9 = left.lower;
  local_98._M_dataplus._M_p = (pointer)0x0;
  local_98._M_string_length = 0x8000000000000000;
  bVar4 = hugeint_t::operator==((hugeint_t *)&stack0xffffffffffffff58,(hugeint_t *)&local_98);
  if (bVar4) {
    hugeint_t::hugeint_t(&local_78,-1);
    bVar4 = hugeint_t::operator==((hugeint_t *)&stack0xffffffffffffff48,&local_78);
    if (bVar4) {
      this_00 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"Overflow in division of %s / %s","");
      hugeint_t::ToString_abi_cxx11_(&local_48,(hugeint_t *)&stack0xffffffffffffff58);
      hugeint_t::ToString_abi_cxx11_(&local_68,(hugeint_t *)&stack0xffffffffffffff48);
      OutOfRangeException::OutOfRangeException<std::__cxx11::string,std::__cxx11::string>
                (this_00,&local_98,&local_48,&local_68);
      __cxa_throw(this_00,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  hugeint_t::hugeint_t((hugeint_t *)&local_98,0);
  bVar4 = hugeint_t::operator==((hugeint_t *)&stack0xffffffffffffff48,(hugeint_t *)&local_98);
  if (bVar4) {
    _Var6._M_head_impl = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    if (_Var6._M_head_impl == (unsigned_long *)0x0) {
      local_78.lower = (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)&local_98,&local_78.lower);
      sVar3 = local_98._M_string_length;
      _Var2._M_p = local_98._M_dataplus._M_p;
      local_98._M_dataplus._M_p = (pointer)0x0;
      local_98._M_string_length = 0;
      this = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)_Var2._M_p;
      (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar3;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length);
        }
      }
      pTVar5 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      _Var6._M_head_impl =
           (pTVar5->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
      (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var6._M_head_impl;
    }
    bVar1 = (byte)idx & 0x3f;
    _Var6._M_head_impl[idx >> 6] =
         _Var6._M_head_impl[idx >> 6] & (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
    hVar11.upper = iVar8;
    hVar11.lower = uVar9;
  }
  else {
    left_00.upper = iVar8;
    left_00.lower = uVar9;
    right_00.upper = iVar10;
    right_00.lower = uVar7;
    hVar11 = ModuloOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                       (left_00,right_00);
  }
  return hVar11;
}

Assistant:

static inline RESULT_TYPE Operation(FUNC fun, LEFT_TYPE left, RIGHT_TYPE right, ValidityMask &mask, idx_t idx) {
		if (left == NumericLimits<LEFT_TYPE>::Minimum() && right == -1) {
			throw OutOfRangeException("Overflow in division of %s / %s", left.ToString(), right.ToString());
		} else if (right == 0) {
			mask.SetInvalid(idx);
			return left;
		} else {
			return OP::template Operation<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(left, right);
		}
	}